

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O3

void basisu::mul_image(imagef *src1,imagef *src2,imagef *dst,vec4F *scale)

{
  vec<4U,_float> *pvVar1;
  vec<4U,_float> *pvVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  vec<4U,_float> *pvVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  vec4F local_38;
  
  local_38.m_v[0] = 0.0;
  local_38.m_v[1] = 0.0;
  local_38.m_v[2] = 0.0;
  local_38.m_v[3] = 1.0;
  imagef::crop(dst,src1->m_width,src1->m_height,0xffffffff,&local_38);
  uVar13 = dst->m_height;
  if (0 < (int)uVar13) {
    uVar15 = dst->m_width;
    uVar12 = 0;
    do {
      bVar19 = uVar15 != 0;
      uVar15 = 0;
      if (bVar19) {
        uVar14 = 0;
        do {
          if ((src1->m_width <= uVar14) || (src1->m_height <= uVar12)) {
LAB_0024f964:
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3d,"const vec4F &basisu::imagef::operator()(uint32_t, uint32_t) const"
                         );
          }
          uVar15 = src1->m_pitch * uVar12 + uVar14;
          if ((src1->m_pixels).m_size <= uVar15) {
LAB_0024f983:
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x177,
                          "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                         );
          }
          if ((src2->m_width <= uVar14) || (src2->m_height <= uVar12)) goto LAB_0024f964;
          uVar17 = src2->m_pitch * uVar12 + uVar14;
          if ((src2->m_pixels).m_size <= uVar17) goto LAB_0024f983;
          if (dst->m_height <= uVar12) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar18 = dst->m_pitch * uVar12 + uVar14;
          if ((dst->m_pixels).m_size <= uVar18) {
            __assert_fail("i < m_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                          ,0x178,
                          "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
                         );
          }
          pvVar16 = (src1->m_pixels).m_p + uVar15;
          fVar3 = pvVar16->m_v[1];
          fVar4 = pvVar16->m_v[2];
          fVar5 = pvVar16->m_v[3];
          pvVar1 = (src2->m_pixels).m_p + uVar17;
          fVar6 = pvVar1->m_v[1];
          fVar7 = pvVar1->m_v[2];
          fVar8 = pvVar1->m_v[3];
          fVar9 = scale->m_v[1];
          fVar10 = scale->m_v[2];
          fVar11 = scale->m_v[3];
          pvVar2 = (dst->m_pixels).m_p + uVar18;
          pvVar2->m_v[0] = scale->m_v[0] * pvVar1->m_v[0] * pvVar16->m_v[0];
          pvVar2->m_v[1] = fVar9 * fVar6 * fVar3;
          pvVar2->m_v[2] = fVar10 * fVar7 * fVar4;
          pvVar2->m_v[3] = fVar11 * fVar8 * fVar5;
          uVar14 = uVar14 + 1;
          uVar15 = dst->m_width;
        } while (uVar14 < uVar15);
        uVar13 = dst->m_height;
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < (int)uVar13);
  }
  return;
}

Assistant:

void mul_image(const imagef &src1, const imagef &src2, imagef &dst, const vec4F &scale)
	{
		dst.resize(src1);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &s1 = src1(x, y);
				const vec4F &s2 = src2(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
				{
					float v1 = s1[c];
					float v2 = s2[c];
					d[c] = v1 * v2 * scale[c];
				}

				dst(x, y) = d;
			}
		}
	}